

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beman_s_challenge.cc
# Opt level: O3

int main(void)

{
  int iVar1;
  vec2i position;
  bool bVar2;
  vec2i vVar3;
  long lVar4;
  window *pwVar5;
  vec2i position_00;
  ulong uVar6;
  long lVar7;
  vec2f vVar8;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  string_view title;
  color4f color;
  color4f color_00;
  optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
  maybe_event;
  window window;
  renderer renderer;
  _Storage<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>,_true>
  local_d0;
  char local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  window local_a8;
  float local_98;
  float fStack_94;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  ulong local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  renderer local_58;
  
  title._M_str = "Beman\'s challenge";
  title._M_len = 0x11;
  hmi::window::window(&local_a8,title,(vec2i)0x24000000400,decorated|visible|resizable);
  hmi::window::get_renderer(&local_58,&local_a8);
  vVar3 = hmi::window::get_size(&local_a8);
  local_b8 = ((float)vVar3.field_0._0_4_ + -610.0) * 0.5;
  fStack_b4 = ((float)vVar3.field_0._4_4_ + -48.541023) * 0.5;
  fStack_b0 = 0.0;
  fStack_ac = 0.0;
  local_98 = 0.0;
  fStack_94 = 0.0;
  uStack_90 = 0;
  uVar6 = 0;
  while( true ) {
    bVar2 = hmi::window::is_open(&local_a8);
    if (!bVar2) break;
    while (pwVar5 = &local_a8,
          hmi::window::poll_event
                    ((optional<std::variant<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>_>
                      *)&local_d0._M_value,&local_a8), local_c0 != '\0') {
      switch(local_d0._M_value.
             super__Variant_base<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Move_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Copy_assign_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Move_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Copy_ctor_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             .
             super__Variant_storage_alias<hmi::window_events::resized,_hmi::window_events::closed,_hmi::window_events::focus_gained,_hmi::window_events::focus_lost,_hmi::window_events::keyboard_key_pressed,_hmi::window_events::keyboard_key_repeated,_hmi::window_events::keyboard_key_released,_hmi::window_events::mouse_button_pressed,_hmi::window_events::mouse_button_released,_hmi::window_events::mouse_moved,_hmi::window_events::mouse_wheel_scrolled,_hmi::window_events::mouse_entered,_hmi::window_events::mouse_left>
             ._M_index) {
      case '\0':
        local_58.m_view_size.field_0._0_4_ = (float)(int)local_d0._0_4_;
        local_58.m_view_size.field_0._4_4_ = (float)(int)local_d0._4_4_;
        break;
      case '\x01':
        hmi::window::close(&local_a8,(int)pwVar5);
        break;
      case '\a':
        position.field_0.data[1] = local_d0._8_4_;
        position.field_0.data[0] = local_d0._4_4_;
        vVar8 = hmi::renderer::get_coords_from_position(&local_58,position);
        if ((local_b8 <= vVar8.field_0._0_4_) && (vVar8.field_0._0_4_ <= local_b8 + 610.0)) {
          if ((fStack_b4 <= vVar8.field_0._4_4_) && (vVar8.field_0._4_4_ <= fStack_b4 + 48.541023))
          {
            local_98 = (float)(int)local_d0._4_4_;
            fStack_94 = (float)(int)local_d0._8_4_;
            uStack_90 = 0;
            uVar6 = CONCAT71((int7)(uVar6 >> 8),1);
          }
        }
        break;
      case '\b':
        uVar6 = 0;
        break;
      case '\t':
        if ((uVar6 & 1) != 0) {
          position_00.field_0._0_4_ = (int)local_98;
          position_00.field_0.data[1] = (int)fStack_94;
          local_88 = (undefined1  [8])hmi::renderer::get_coords_from_position(&local_58,position_00)
          ;
          uStack_80 = extraout_XMM0_Qb;
          vVar3.field_0.data[1] = local_d0._4_4_;
          vVar3.field_0.data[0] = local_d0._0_4_;
          vVar8 = hmi::renderer::get_coords_from_position(&local_58,vVar3);
          local_b8 = local_b8 + (vVar8.field_0._0_4_ - (float)local_88._0_4_);
          fStack_b4 = fStack_b4 + (vVar8.field_0._4_4_ - (float)local_88._4_4_);
          fStack_b0 = fStack_b0 + ((float)extraout_XMM0_Qb_00 - (float)uStack_80);
          fStack_ac = fStack_ac + ((float)((ulong)extraout_XMM0_Qb_00 >> 0x20) - uStack_80._4_4_);
        }
        local_98 = (float)(int)local_d0._0_4_;
        fStack_94 = (float)(int)local_d0._4_4_;
        uStack_90 = 0;
      }
    }
    color.field_0._8_8_ = 0x3f8000003f800000;
    color.field_0._0_8_ = 0x3f8000003f800000;
    hmi::renderer::clear(&local_58,color);
    local_68 = fStack_b4;
    fStack_64 = fStack_b4;
    fStack_60 = fStack_b4;
    fStack_5c = fStack_b4;
    lVar7 = 0;
    local_70 = uVar6;
    do {
      iVar1 = (&_ZL12g_hello_text_rel)[lVar7];
      _local_88 = ZEXT416((uint)((float)(int)lVar7 * 9.708204 + local_68));
      lVar4 = 0;
      do {
        if (*(char *)((long)&_ZL12g_hello_text_rel + iVar1 + lVar4) == '#') {
          vVar8.field_0._0_4_ = (float)(int)lVar4 * 10.0 + local_b8;
          vVar8.field_0.data[1] = (float)local_88._0_4_;
          color_00.field_0._8_8_ = 0x3f80000000000000;
          color_00.field_0._0_8_ = 0x3f800000;
          hmi::renderer::fill_rectangle(&local_58,vVar8,(vec2f)0x411b54ce41200000,color_00);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x3d);
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    hmi::renderer::display(&local_58);
    uVar6 = local_70;
  }
  hmi::renderer::~renderer(&local_58);
  hmi::window::~window(&local_a8);
  return 0;
}

Assistant:

int main() {
  hmi::window window("Beman's challenge", { 1024, 576 });

  auto renderer = window.get_renderer();

  hmi::vec2i hello_size = { static_cast<int>(std::strlen(g_hello_text[0])), 5 };
  hmi::vec2f pixel_size = { 10.0f, 10.0f * 3 / 5 * 1.61803398875f };
  hmi::vec2f size = hello_size * pixel_size;

  hmi::vec2f position = (window.get_size() - size) / 2;
  bool dragging = false;
  hmi::vec2f mouse_position = { 0, 0 };

  while (window.is_open()) {

    while (auto maybe_event = window.poll_event()) {
      auto& event = maybe_event.value();

      if (std::get_if<hmi::window_events::closed>(&event)) {
        window.close();
      } else if (auto pevent = std::get_if<hmi::window_events::mouse_button_pressed>(&event)) {
        hmi::vec2f cursor = renderer.get_coords_from_position(pevent->position);

        if (position.x <= cursor.x && cursor.x <= position.x + size.width && position.y <= cursor.y && cursor.y <= position.y + size.height) {
          dragging = true;
          mouse_position = pevent->position;
        }
      } else if (std::get_if<hmi::window_events::mouse_button_released>(&event)) {
        dragging = false;
      } else if (auto pevent = std::get_if<hmi::window_events::mouse_moved>(&event)) {
        if (dragging) {
          hmi::vec2f old_cursor = renderer.get_coords_from_position(mouse_position);
          hmi::vec2f new_cursor = renderer.get_coords_from_position(pevent->position);
          position += (new_cursor - old_cursor);
        }

        mouse_position = pevent->position;
      } else if (auto pevent = std::get_if<hmi::window_events::resized>(&event)) {
        renderer.set_view_size(pevent->size);
      }

    }

    renderer.clear(hmi::color::white);

    hmi::vec2i index;

    for (index.y = 0; index.y < hello_size.height; index.y++) {
      for (index.x = 0; index.x < hello_size.width; ++index.x) {
        if (g_hello_text[index.y][index.x] == '#') {
          hmi::vec2f pixel_position = position + index * pixel_size;
          renderer.fill_rectangle(pixel_position, pixel_size, hmi::color::red);
        }
      }
    }

    renderer.display();
  }

  return 0;
}